

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateExtensionRegistrationCode
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  int iVar2;
  FieldDescriptor *descriptor;
  Descriptor *descriptor_00;
  MessageGenerator local_78;
  int local_58;
  int i_1;
  ExtensionGenerator local_48;
  int local_1c;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_1c = 0;
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  while( true ) {
    iVar1 = local_1c;
    iVar2 = Descriptor::extension_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    descriptor = Descriptor::extension(this->descriptor_,local_1c);
    ExtensionGenerator::ExtensionGenerator(&local_48,descriptor);
    ExtensionGenerator::GenerateRegistrationCode(&local_48,pPStack_18);
    ExtensionGenerator::~ExtensionGenerator(&local_48);
    local_1c = local_1c + 1;
  }
  local_58 = 0;
  while( true ) {
    iVar1 = local_58;
    iVar2 = Descriptor::nested_type_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    descriptor_00 = Descriptor::nested_type(this->descriptor_,local_58);
    MessageGenerator(&local_78,descriptor_00);
    GenerateExtensionRegistrationCode(&local_78,pPStack_18);
    ~MessageGenerator(&local_78);
    local_58 = local_58 + 1;
  }
  return;
}

Assistant:

void MessageGenerator::GenerateExtensionRegistrationCode(io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ExtensionGenerator(descriptor_->extension(i))
      .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    MessageGenerator(descriptor_->nested_type(i))
      .GenerateExtensionRegistrationCode(printer);
  }
}